

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssimpCExport.cpp
# Opt level: O3

aiExportDataBlob * aiExportSceneToBlob(aiScene *pScene,char *pFormatId,uint pPreprocessing)

{
  aiExportDataBlob *paVar1;
  Exporter exp;
  Exporter EStack_28;
  
  Assimp::Exporter::Exporter(&EStack_28);
  paVar1 = Assimp::Exporter::ExportToBlob
                     (&EStack_28,pScene,pFormatId,pPreprocessing,(ExportProperties *)0x0);
  if (paVar1 == (aiExportDataBlob *)0x0) {
    paVar1 = (aiExportDataBlob *)0x0;
  }
  else {
    paVar1 = Assimp::Exporter::GetOrphanedBlob(&EStack_28);
    if (paVar1 == (aiExportDataBlob *)0x0) {
      __assert_fail("blob",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/CApi/AssimpCExport.cpp"
                    ,0x91,
                    "const aiExportDataBlob *aiExportSceneToBlob(const aiScene *, const char *, unsigned int)"
                   );
    }
  }
  Assimp::Exporter::~Exporter(&EStack_28);
  return paVar1;
}

Assistant:

ASSIMP_API const C_STRUCT aiExportDataBlob* aiExportSceneToBlob( const aiScene* pScene, const char* pFormatId, unsigned int pPreprocessing  )
{
    Exporter exp;
    if (!exp.ExportToBlob(pScene,pFormatId,pPreprocessing)) {
        return NULL;
    }
    const aiExportDataBlob* blob = exp.GetOrphanedBlob();
    ai_assert(blob);

    return blob;
}